

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slinsol.c
# Opt level: O1

int main(int argc,char **argv)

{
  FILE *fp;
  int ldx;
  float *pfVar1;
  float *x;
  int *perm_c;
  int *perm_r;
  int n;
  int m;
  mem_usage_t mem_usage;
  int_t info;
  int_t nnz;
  float *local_268;
  int_t *xa;
  SuperMatrix U;
  SuperMatrix L;
  int_t *asub;
  float *a;
  SuperMatrix A;
  SuperMatrix B;
  superlu_options_t options;
  SuperLUStat_t stat;
  
  fp = _stdin;
  set_default_options(&options);
  sreadhb(fp,&m,&n,&nnz,&a,&asub,&xa);
  sCreate_CompCol_Matrix(&A,m,n,nnz,a,asub,xa,SLU_NC,SLU_S,SLU_GE);
  printf("Dimension %dx%d; # nonzeros %d\n",(ulong)(uint)A.nrow,(ulong)(uint)A.ncol,(ulong)*A.Store)
  ;
  pfVar1 = floatMalloc((long)m);
  if (pfVar1 == (float *)0x0) {
    sprintf((char *)&stat,"%s at line %d in file %s\n","Malloc fails for rhs[].",0x4b,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsol.c"
           );
    superlu_abort_and_exit((char *)&stat);
  }
  sCreate_Dense_Matrix(&B,m,1,pfVar1,m,SLU_DN,SLU_S,SLU_GE);
  x = floatMalloc((long)n);
  ldx = n;
  sGenXtrue(n,1,x,n);
  sFillRHS(options.Trans,1,x,ldx,&A,&B);
  perm_c = int32Malloc(n);
  if (perm_c == (int *)0x0) {
    sprintf((char *)&stat,"%s at line %d in file %s\n","Malloc fails for perm_c[].",0x52,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsol.c"
           );
    superlu_abort_and_exit((char *)&stat);
  }
  local_268 = pfVar1;
  perm_r = int32Malloc(m);
  if (perm_r == (int *)0x0) {
    sprintf((char *)&stat,"%s at line %d in file %s\n","Malloc fails for perm_r[].",0x53,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/slinsol.c"
           );
    superlu_abort_and_exit((char *)&stat);
  }
  StatInit(&stat);
  sgssv(&options,&A,perm_c,perm_r,&L,&U,&B,&stat,&info);
  if (info == 0) {
    sinf_norm_error(1,&B,x);
    printf("No of nonzeros in factor L = %lld\n",(long)*L.Store);
    printf("No of nonzeros in factor U = %lld\n",(long)*U.Store);
    printf("No of nonzeros in L+U = %lld\n",((long)*U.Store + (long)*L.Store) - (long)n);
    printf("FILL ratio = %.1f\n",(double)((float)((*U.Store + *L.Store) - n) / (float)nnz));
    sQuerySpace(&L,&U,&mem_usage);
    pfVar1 = local_268;
  }
  else {
    printf("sgssv() error returns INFO= %lld\n");
    pfVar1 = local_268;
    if (n < info) goto LAB_001017df;
    sQuerySpace(&L,&U,&mem_usage);
  }
  printf("L\\U MB %.3f\ttotal MB needed %.3f\n",(double)mem_usage.for_lu / 1000000.0,
         (double)mem_usage.total_needed / 1000000.0);
LAB_001017df:
  if (options.PrintStat != NO) {
    StatPrint(&stat);
  }
  StatFree(&stat);
  superlu_free(pfVar1);
  superlu_free(x);
  superlu_free(perm_r);
  superlu_free(perm_c);
  Destroy_CompCol_Matrix(&A);
  Destroy_SuperMatrix_Store(&B);
  Destroy_SuperNode_Matrix(&L);
  Destroy_CompCol_Matrix(&U);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    SuperMatrix A;
    NCformat *Astore;
    float   *a;
    int_t    *asub, *xa;
    int      *perm_c; /* column permutation vector */
    int      *perm_r; /* row permutations from partial pivoting */
    SuperMatrix L;      /* factor L */
    SCformat *Lstore;
    SuperMatrix U;      /* factor U */
    NCformat *Ustore;
    SuperMatrix B;
    int      nrhs, ldx, m, n;
    int_t    nnz, info;
    float   *xact, *rhs;
    mem_usage_t   mem_usage;
    superlu_options_t options;
    SuperLUStat_t stat;
    FILE      *fp = stdin;
    
#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Enter main()");
#endif

    /* Set the default input options:
	options.Fact = DOFACT;
        options.Equil = YES;
    	options.ColPerm = COLAMD;
	options.DiagPivotThresh = 1.0;
    	options.Trans = NOTRANS;
    	options.IterRefine = NOREFINE;
    	options.SymmetricMode = NO;
    	options.PivotGrowth = NO;
    	options.ConditionNumber = NO;
    	options.PrintStat = YES;
     */
    set_default_options(&options);

    /* Read the matrix in Harwell-Boeing format. */
    sreadhb(fp, &m, &n, &nnz, &a, &asub, &xa);

    sCreate_CompCol_Matrix(&A, m, n, nnz, a, asub, xa, SLU_NC, SLU_S, SLU_GE);
    Astore = A.Store;
    printf("Dimension %dx%d; # nonzeros %d\n", (int)A.nrow, (int)A.ncol, (int)Astore->nnz);
    
    nrhs   = 1;
    if ( !(rhs = floatMalloc(m * nrhs)) ) ABORT("Malloc fails for rhs[].");
    sCreate_Dense_Matrix(&B, m, nrhs, rhs, m, SLU_DN, SLU_S, SLU_GE);
    xact = floatMalloc(n * nrhs);
    ldx = n;
    sGenXtrue(n, nrhs, xact, ldx);
    sFillRHS(options.Trans, nrhs, xact, ldx, &A, &B);

    if ( !(perm_c = int32Malloc(n)) ) ABORT("Malloc fails for perm_c[].");
    if ( !(perm_r = int32Malloc(m)) ) ABORT("Malloc fails for perm_r[].");

    /* Initialize the statistics variables. */
    StatInit(&stat);
    
    sgssv(&options, &A, perm_c, perm_r, &L, &U, &B, &stat, &info);
    
    if ( info == 0 ) {

	/* This is how you could access the solution matrix. */
        float *sol = (float*) ((DNformat*) B.Store)->nzval; 
        (void)sol;  // suppress unused variable warning

	 /* Compute the infinity norm of the error. */
	sinf_norm_error(nrhs, &B, xact);

	Lstore = (SCformat *) L.Store;
	Ustore = (NCformat *) U.Store;
    	printf("No of nonzeros in factor L = %lld\n", (long long) Lstore->nnz);
    	printf("No of nonzeros in factor U = %lld\n", (long long) Ustore->nnz);
    	printf("No of nonzeros in L+U = %lld\n", (long long) Lstore->nnz + Ustore->nnz - n);
    	printf("FILL ratio = %.1f\n", (float)(Lstore->nnz + Ustore->nnz - n)/nnz);
	
	sQuerySpace(&L, &U, &mem_usage);
	printf("L\\U MB %.3f\ttotal MB needed %.3f\n",
	       mem_usage.for_lu/1e6, mem_usage.total_needed/1e6);
	
    } else {
	printf("sgssv() error returns INFO= %lld\n", (long long)info);
	if ( info <= n ) { /* factorization completes */
	    sQuerySpace(&L, &U, &mem_usage);
	    printf("L\\U MB %.3f\ttotal MB needed %.3f\n",
		   mem_usage.for_lu/1e6, mem_usage.total_needed/1e6);
	}
    }

    if ( options.PrintStat ) StatPrint(&stat);
    StatFree(&stat);

    SUPERLU_FREE (rhs);
    SUPERLU_FREE (xact);
    SUPERLU_FREE (perm_r);
    SUPERLU_FREE (perm_c);
    Destroy_CompCol_Matrix(&A);
    Destroy_SuperMatrix_Store(&B);
    Destroy_SuperNode_Matrix(&L);
    Destroy_CompCol_Matrix(&U);

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Exit main()");
#endif

    return EXIT_SUCCESS;
}